

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightBounds * pbrt::Union(LightBounds *a,LightBounds *b)

{
  void *in_RDX;
  void *in_RSI;
  LightBounds *in_RDI;
  float fVar1;
  Float theta_o;
  DirectionCone c;
  Float in_stack_ffffffffffffff98;
  Float in_stack_ffffffffffffff9c;
  DirectionCone *in_stack_ffffffffffffffa0;
  Bounds3f *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb4;
  Bounds3<float> *in_stack_ffffffffffffffc8;
  Bounds3<float> *in_stack_ffffffffffffffd0;
  
  if ((*(float *)((long)in_RSI + 0x24) != 0.0) || (NAN(*(float *)((long)in_RSI + 0x24)))) {
    if ((*(float *)((long)in_RDX + 0x24) != 0.0) || (NAN(*(float *)((long)in_RDX + 0x24)))) {
      DirectionCone::DirectionCone
                (in_stack_ffffffffffffffa0,
                 (Vector3f *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (Float)((ulong)in_RDI >> 0x20));
      DirectionCone::DirectionCone
                (in_stack_ffffffffffffffa0,
                 (Vector3f *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (Float)((ulong)in_RDI >> 0x20));
      Union((DirectionCone *)c._12_8_,(DirectionCone *)c.w.super_Tuple3<pbrt::Vector3,_float>._4_8_)
      ;
      fVar1 = SafeACos(0.0);
      Union<float>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      std::max<float>((float *)((long)in_RSI + 0x2c),(float *)((long)in_RDX + 0x2c));
      LightBounds::LightBounds
                ((LightBounds *)CONCAT44(in_stack_ffffffffffffffb4,fVar1),in_stack_ffffffffffffffa8,
                 &in_stack_ffffffffffffffa0->w,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                 (Float)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    }
    else {
      memcpy(in_RDI,in_RSI,0x3c);
    }
  }
  else {
    memcpy(in_RDI,in_RDX,0x3c);
  }
  return in_RDI;
}

Assistant:

LightBounds Union(const LightBounds &a, const LightBounds &b) {
    if (a.phi == 0)
        return b;
    if (b.phi == 0)
        return a;
    DirectionCone c =
        Union(DirectionCone(a.w, a.cosTheta_o), DirectionCone(b.w, b.cosTheta_o));
    Float theta_o = SafeACos(c.cosTheta);
    return LightBounds(Union(a.b, b.b), c.w, a.phi + b.phi, theta_o,
                       std::max(a.theta_e, b.theta_e), a.twoSided | b.twoSided);
}